

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O2

Vec_Int_t * Abc_NtkCollectEquivClasses(Abc_Ntk_t **pNtks,Gia_Man_t *pGia)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Abc_Obj_t *pAVar6;
  ulong uVar7;
  int i_00;
  long lVar8;
  int i;
  uint i_01;
  int iVar9;
  Vec_Int_t *vNexts [2];
  
  p = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(1000);
  p_01 = Vec_IntStartFull(pGia->nObjs);
  p_02 = Vec_IntStartFull((*pNtks)->vObjs->nSize);
  vNexts[0] = p_02;
  p_03 = Vec_IntStartFull(pNtks[1]->vObjs->nSize);
  vNexts[1] = p_03;
  for (iVar9 = 0; iVar9 < (*pNtks)->vCis->nSize; iVar9 = iVar9 + 1) {
    pAVar6 = Abc_NtkCi(*pNtks,iVar9);
    Abc_NtkCollectAddOne(0,pAVar6->Id,(pAVar6->field_6).iTemp,pGia,p_01,vNexts);
  }
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    for (iVar9 = 0; iVar9 < pNtks[lVar8]->vObjs->nSize; iVar9 = iVar9 + 1) {
      pAVar6 = Abc_NtkObj(pNtks[lVar8],iVar9);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
        Abc_NtkCollectAddOne((int)lVar8,pAVar6->Id,(pAVar6->field_6).iTemp,pGia,p_01,vNexts);
      }
    }
  }
  iVar9 = p_01->nSize;
  i_00 = 0;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  for (; i_00 != iVar9; i_00 = i_00 + 1) {
    uVar2 = Vec_IntEntry(p_01,i_00);
    p->nSize = 0;
    for (; -1 < (int)uVar2; uVar2 = Vec_IntEntry(vNexts[uVar2 & 1],uVar2 >> 2)) {
      Vec_IntPush(p,uVar2);
    }
    uVar2 = p->nSize;
    if (1 < (int)uVar2) {
      uVar3 = uVar2;
      for (uVar7 = 0; uVar3 = uVar3 - 1, uVar2 >> 1 != uVar7; uVar7 = uVar7 + 1) {
        piVar1 = p->pArray;
        iVar5 = piVar1[uVar7];
        piVar1[uVar7] = piVar1[(int)uVar3];
        piVar1[(int)uVar3] = iVar5;
      }
      uVar3 = Vec_IntEntry(p,0);
      for (i_01 = 0; uVar2 != i_01; i_01 = i_01 + 1) {
        uVar4 = Vec_IntEntry(p,i_01);
        Vec_IntWriteEntry(p,i_01,uVar4 ^ uVar3 & 2);
      }
      Vec_IntPush(p_00,uVar2);
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        iVar5 = Vec_IntEntry(p,uVar3);
        Vec_IntPush(p_00,iVar5);
      }
    }
  }
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  Vec_IntFree(p);
  return p_00;
}

Assistant:

Vec_Int_t * Abc_NtkCollectEquivClasses( Abc_Ntk_t * pNtks[2], Gia_Man_t * pGia )
{
    Vec_Int_t * vClass = Vec_IntAlloc( 100 );
    Vec_Int_t * vClasses = Vec_IntAlloc( 1000 );
    Vec_Int_t * vGia2Cla = Vec_IntStartFull( Gia_ManObjNum(pGia) ); // mapping objId into classId
    Vec_Int_t * vNexts[2] = { Vec_IntStartFull(Abc_NtkObjNumMax(pNtks[0])), Vec_IntStartFull(Abc_NtkObjNumMax(pNtks[1])) };
    Abc_Obj_t * pObj;
    int n, i, k, Entry, fCompl;
    Abc_NtkForEachCi( pNtks[0], pObj, i )
        Abc_NtkCollectAddOne( 0, Abc_ObjId(pObj), pObj->iTemp, pGia, vGia2Cla, vNexts );
    for ( n = 0; n < 2; n++ )
        Abc_NtkForEachNode( pNtks[n], pObj, i )
            Abc_NtkCollectAddOne( n, Abc_ObjId(pObj), pObj->iTemp, pGia, vGia2Cla, vNexts );
    Vec_IntForEachEntry( vGia2Cla, Entry, i )
    {
        Vec_IntClear( vClass );
        for ( ; Entry >= 0; Entry = Vec_IntEntry(vNexts[Entry&1], Entry>>2) )
            Vec_IntPush( vClass, Entry );
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        Vec_IntReverseOrder( vClass );
        fCompl = 2 & Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntry( vClass, Entry, k )
            Vec_IntWriteEntry( vClass, k, Entry ^ fCompl );        
        Vec_IntPush( vClasses, Vec_IntSize(vClass) );
        Vec_IntAppend( vClasses, vClass );
    }
    Vec_IntFree( vGia2Cla );
    Vec_IntFree( vNexts[0] );
    Vec_IntFree( vNexts[1] );
    Vec_IntFree( vClass );
    return vClasses;
}